

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reassociation.cpp
# Opt level: O0

bool __thiscall mocker::detail::ReassociationImpl::operator()(ReassociationImpl *this)

{
  bool bVar1;
  mapped_type *this_00;
  size_type sVar2;
  mapped_type *this_01;
  reference psVar3;
  pair<std::__detail::_Node_iterator<std::shared_ptr<mocker::ir::Reg>,_true,_true>,_bool> pVar4;
  shared_ptr<mocker::ir::Reg> *root_2;
  iterator __end1_3;
  iterator __begin1_3;
  RegSet *__range1_3;
  shared_ptr<mocker::ir::Reg> *root_1;
  iterator __end1_2;
  iterator __begin1_2;
  RegSet *__range1_2;
  _Node_iterator_base<std::shared_ptr<mocker::ir::Reg>,_true> local_a8;
  undefined1 local_a0;
  undefined1 local_98 [8];
  vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
  nodes;
  pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::detail::ReassociationImpl::Node>_>
  *kv;
  iterator __end1_1;
  iterator __begin1_1;
  RegMap<std::shared_ptr<Node>_> *__range1_1;
  shared_ptr<mocker::ir::Addr> local_50;
  DefUseChain *local_30;
  shared_ptr<mocker::ir::Reg> *root;
  iterator __end1;
  iterator __begin1;
  RegSet *__range1;
  ReassociationImpl *this_local;
  
  findRoots(this);
  __end1 = std::
           unordered_set<std::shared_ptr<mocker::ir::Reg>,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>_>
           ::begin(&this->roots);
  root = (shared_ptr<mocker::ir::Reg> *)
         std::
         unordered_set<std::shared_ptr<mocker::ir::Reg>,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>_>
         ::end(&this->roots);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1.super__Node_iterator_base<std::shared_ptr<mocker::ir::Reg>,_true>,
                       (_Node_iterator_base<std::shared_ptr<mocker::ir::Reg>,_true> *)&root);
    if (!bVar1) break;
    local_30 = (DefUseChain *)
               std::__detail::_Node_iterator<std::shared_ptr<mocker::ir::Reg>,_true,_true>::
               operator*(&__end1);
    std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
              (&local_50,(shared_ptr<mocker::ir::Reg> *)local_30);
    buildTrees((ReassociationImpl *)&stack0xffffffffffffffc0,(shared_ptr<mocker::ir::Addr> *)this,
               SUB81(&local_50,0));
    this_00 = std::
              unordered_map<std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::detail::ReassociationImpl::Node>,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::detail::ReassociationImpl::Node>_>_>_>
              ::operator[](&this->trees,(key_type *)local_30);
    std::shared_ptr<mocker::detail::ReassociationImpl::Node>::operator=
              (this_00,(shared_ptr<mocker::detail::ReassociationImpl::Node> *)
                       &stack0xffffffffffffffc0);
    std::shared_ptr<mocker::detail::ReassociationImpl::Node>::~shared_ptr
              ((shared_ptr<mocker::detail::ReassociationImpl::Node> *)&stack0xffffffffffffffc0);
    std::shared_ptr<mocker::ir::Addr>::~shared_ptr(&local_50);
    std::__detail::_Node_iterator<std::shared_ptr<mocker::ir::Reg>,_true,_true>::operator++(&__end1)
    ;
  }
  __end1_1 = std::
             unordered_map<std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::detail::ReassociationImpl::Node>,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::detail::ReassociationImpl::Node>_>_>_>
             ::begin(&this->trees);
  kv = (pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::detail::ReassociationImpl::Node>_>
        *)std::
          unordered_map<std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::detail::ReassociationImpl::Node>,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::detail::ReassociationImpl::Node>_>_>_>
          ::end(&this->trees);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1_1.
                        super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::detail::ReassociationImpl::Node>_>,_true>
                       ,(_Node_iterator_base<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::detail::ReassociationImpl::Node>_>,_true>
                         *)&kv);
    if (!bVar1) break;
    nodes.
    super__Vector_base<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::__detail::
                  _Node_iterator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::detail::ReassociationImpl::Node>_>,_false,_true>
                  ::operator*(&__end1_1);
    flatten((vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
             *)local_98,this,
            &((reference)
             nodes.
             super__Vector_base<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage)->second);
    sVar2 = std::
            vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
            ::size((vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
                    *)local_98);
    if (sVar2 < 10) {
      pVar4 = std::
              unordered_set<std::shared_ptr<mocker::ir::Reg>,mocker::ir::RegPtrHash,mocker::ir::RegPtrEqual,std::allocator<std::shared_ptr<mocker::ir::Reg>>>
              ::emplace<std::shared_ptr<mocker::ir::Reg>const&>
                        ((unordered_set<std::shared_ptr<mocker::ir::Reg>,mocker::ir::RegPtrHash,mocker::ir::RegPtrEqual,std::allocator<std::shared_ptr<mocker::ir::Reg>>>
                          *)&this->doNotRebuild,
                         (shared_ptr<mocker::ir::Reg> *)
                         nodes.
                         super__Vector_base<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_a8._M_cur =
           (__node_type *)
           pVar4.first.super__Node_iterator_base<std::shared_ptr<mocker::ir::Reg>,_true>._M_cur;
      local_a0 = pVar4.second;
    }
    cancel((vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
            *)&__range1_2,this,
           (vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
            *)local_98);
    this_01 = std::
              unordered_map<std::shared_ptr<mocker::ir::Reg>,_std::vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>_>_>_>
              ::operator[](&this->flattenedNodes,
                           (key_type *)
                           nodes.
                           super__Vector_base<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
    ::operator=(this_01,(vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
                         *)&__range1_2);
    std::
    vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
    ::~vector((vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
               *)&__range1_2);
    std::
    vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
    ::~vector((vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
               *)local_98);
    std::__detail::
    _Node_iterator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::detail::ReassociationImpl::Node>_>,_false,_true>
    ::operator++(&__end1_1);
  }
  __end1_2 = std::
             unordered_set<std::shared_ptr<mocker::ir::Reg>,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>_>
             ::begin(&this->roots);
  root_1 = (shared_ptr<mocker::ir::Reg> *)
           std::
           unordered_set<std::shared_ptr<mocker::ir::Reg>,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>_>
           ::end(&this->roots);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1_2.super__Node_iterator_base<std::shared_ptr<mocker::ir::Reg>,_true>,
                       (_Node_iterator_base<std::shared_ptr<mocker::ir::Reg>,_true> *)&root_1);
    if (!bVar1) break;
    psVar3 = std::__detail::_Node_iterator<std::shared_ptr<mocker::ir::Reg>,_true,_true>::operator*
                       (&__end1_2);
    rankNodes(this,psVar3);
    std::__detail::_Node_iterator<std::shared_ptr<mocker::ir::Reg>,_true,_true>::operator++
              (&__end1_2);
  }
  __end1_3 = std::
             unordered_set<std::shared_ptr<mocker::ir::Reg>,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>_>
             ::begin(&this->roots);
  root_2 = (shared_ptr<mocker::ir::Reg> *)
           std::
           unordered_set<std::shared_ptr<mocker::ir::Reg>,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>_>
           ::end(&this->roots);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1_3.super__Node_iterator_base<std::shared_ptr<mocker::ir::Reg>,_true>,
                       (_Node_iterator_base<std::shared_ptr<mocker::ir::Reg>,_true> *)&root_2);
    if (!bVar1) break;
    psVar3 = std::__detail::_Node_iterator<std::shared_ptr<mocker::ir::Reg>,_true,_true>::operator*
                       (&__end1_3);
    rebuild(this,psVar3);
    std::__detail::_Node_iterator<std::shared_ptr<mocker::ir::Reg>,_true,_true>::operator++
              (&__end1_3);
  }
  removeDeletedInsts(this->func);
  return false;
}

Assistant:

bool detail::ReassociationImpl::operator()() {
  findRoots();
  for (auto &root : roots) {
    trees[root] = buildTrees(root, true);
  }
  for (auto &kv : trees) {
    auto nodes = flatten(kv.second);
    if (nodes.size() < 10)
      doNotRebuild.emplace(kv.first);
    flattenedNodes[kv.first] = cancel(nodes);
  }

  for (auto &root : roots) {
    rankNodes(root);
  }

  for (auto &root : roots) {
    rebuild(root);
  }

  removeDeletedInsts(func);

  return false;
}